

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# idasHessian_ASA_FSA.c
# Opt level: O3

int res(sunrealtype tres,N_Vector yy,N_Vector yp,N_Vector rr,void *user_data)

{
  double dVar1;
  double dVar2;
  double dVar3;
  double dVar4;
  double dVar5;
  double dVar6;
  double *pdVar7;
  double dVar8;
  
  pdVar7 = *(double **)((long)yy->content + 0x10);
  dVar1 = *pdVar7;
  dVar2 = pdVar7[1];
  dVar3 = pdVar7[2];
  pdVar7 = *(double **)((long)yp->content + 0x10);
  dVar5 = *pdVar7;
  dVar6 = pdVar7[1];
  pdVar7 = (double *)N_VGetArrayPointer(rr);
  dVar8 = *user_data * dVar1 - *(double *)((long)user_data + 8) * dVar2 * dVar3;
  dVar4 = *(double *)((long)user_data + 0x10);
  *pdVar7 = dVar8 + dVar5;
  pdVar7[1] = (dVar4 * dVar2 * dVar2 - dVar8) + dVar6;
  pdVar7[2] = dVar1 + dVar2 + dVar3 + -1.0;
  return 0;
}

Assistant:

static int res(sunrealtype tres, N_Vector yy, N_Vector yp, N_Vector rr,
               void* user_data)
{
  sunrealtype y1, y2, y3, yp1, yp2, *rval;
  UserData data;
  sunrealtype p1, p2, p3;

  y1   = Ith(yy, 1);
  y2   = Ith(yy, 2);
  y3   = Ith(yy, 3);
  yp1  = Ith(yp, 1);
  yp2  = Ith(yp, 2);
  rval = N_VGetArrayPointer(rr);

  data = (UserData)user_data;
  p1   = data->p[0];
  p2   = data->p[1];
  p3   = data->p[2];

  rval[0] = p1 * y1 - p2 * y2 * y3;
  rval[1] = -rval[0] + p3 * y2 * y2 + yp2;
  rval[0] += yp1;
  rval[2] = y1 + y2 + y3 - 1;

  return (0);
}